

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O3

ExprNode * __thiscall Canonicalizer::visit(Canonicalizer *this,BINOP *node)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ESEQ *this_00;
  undefined4 extraout_var;
  StmNode *pSVar4;
  BINOP *pBVar5;
  undefined4 extraout_var_00;
  ExprNode *pEVar6;
  undefined4 extraout_var_01;
  Temp *this_01;
  MOVE *this_02;
  TEMP *pTVar7;
  undefined4 extraout_var_02;
  ESEQ *this_03;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  
  if ((&node->left->super_StmNode == (StmNode *)0x0) ||
     (iVar1 = StmNode::getTypeStm(&node->left->super_StmNode), iVar1 != 7)) {
    iVar1 = StmNode::getTypeStm(&node->right->super_StmNode);
    if (iVar1 == 7) {
      this->changed = true;
      pEVar6 = node->right;
      this_01 = (Temp *)operator_new(0x10);
      Temp::Temp(this_01);
      iVar1 = StmNode::getTypeStm(&node->left->super_StmNode);
      this_00 = (ESEQ *)operator_new(0x20);
      if (iVar1 == 0) {
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[4])(pEVar6);
        pSVar4 = (StmNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar1) + 0x18))
                           ((long *)CONCAT44(extraout_var_07,iVar1),this);
        pBVar5 = (BINOP *)operator_new(0x20);
        iVar1 = node->binop;
        iVar2 = (*(node->left->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->left,this);
        iVar3 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[5])(pEVar6);
        pEVar6 = (ExprNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x18))
                           ((long *)CONCAT44(extraout_var_09,iVar3),this);
        BINOP::BINOP(pBVar5,iVar1,(ExprNode *)CONCAT44(extraout_var_08,iVar2),pEVar6);
        ESEQ::ESEQ(this_00,pSVar4,(ExprNode *)pBVar5);
      }
      else {
        this_02 = (MOVE *)operator_new(0x20);
        pTVar7 = (TEMP *)operator_new(0x18);
        TEMP::TEMP(pTVar7,this_01);
        iVar1 = (*(node->left->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->left,this);
        MOVE::MOVE(this_02,(ExprNode *)pTVar7,(ExprNode *)CONCAT44(extraout_var_02,iVar1));
        this_03 = (ESEQ *)operator_new(0x20);
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[4])(pEVar6);
        pSVar4 = (StmNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x18))
                           ((long *)CONCAT44(extraout_var_03,iVar1),this);
        pBVar5 = (BINOP *)operator_new(0x20);
        iVar1 = node->binop;
        pTVar7 = (TEMP *)operator_new(0x18);
        TEMP::TEMP(pTVar7,this_01);
        iVar2 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[5])(pEVar6);
        pEVar6 = (ExprNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x18))
                           ((long *)CONCAT44(extraout_var_04,iVar2),this);
        BINOP::BINOP(pBVar5,iVar1,(ExprNode *)pTVar7,pEVar6);
        ESEQ::ESEQ(this_03,pSVar4,(ExprNode *)pBVar5);
        ESEQ::ESEQ(this_00,(StmNode *)this_02,(ExprNode *)this_03);
      }
    }
    else {
      pEVar6 = node->left;
      if (pEVar6 != (ExprNode *)0x0) {
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[3])(pEVar6,this);
        BINOP::setLeft(node,(ExprNode *)CONCAT44(extraout_var_05,iVar1));
      }
      pEVar6 = node->right;
      this_00 = (ESEQ *)node;
      if (pEVar6 != (ExprNode *)0x0) {
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[3])(pEVar6,this);
        BINOP::setRight(node,(ExprNode *)CONCAT44(extraout_var_06,iVar1));
      }
    }
  }
  else {
    this->changed = true;
    pEVar6 = node->left;
    this_00 = (ESEQ *)operator_new(0x20);
    iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[4])(pEVar6);
    pSVar4 = (StmNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var,iVar1),this);
    pBVar5 = (BINOP *)operator_new(0x20);
    iVar1 = node->binop;
    iVar2 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[5])(pEVar6);
    pEVar6 = (ExprNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                       ((long *)CONCAT44(extraout_var_00,iVar2),this);
    iVar2 = (*(node->right->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->right,this);
    BINOP::BINOP(pBVar5,iVar1,pEVar6,(ExprNode *)CONCAT44(extraout_var_01,iVar2));
    ESEQ::ESEQ(this_00,pSVar4,(ExprNode *)pBVar5);
  }
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Canonicalizer::visit(BINOP *node) {
    if (node->getLeft() && node->getLeft()->getTypeStm() == V_ESEQ) {
        changed = true;
        ExprNode *eseq = node->getLeft();

        return new ESEQ(eseq->getS()->accept(this),
                        new BINOP(node->getBinop(), eseq->getE()->accept(this),
                                  node->getRight()->accept(this)));

    }
    if (node->getRight()->getTypeStm() == V_ESEQ) {
        changed = true;
        ExprNode *eseq = node->getRight();
        Temp *t = new Temp();

        if (node->getLeft()->getTypeStm() == V_CONST) {

            return new ESEQ(eseq->getS()->accept(this),
                            new BINOP(node->getBinop(), node->getLeft()->accept(this),
                                      eseq->getE()->accept(this)));
        } else {
            return new ESEQ(new MOVE(new TEMP(t), node->getLeft()->accept(this)),
                            new ESEQ(eseq->getS()->accept(this),
                                     new BINOP(node->getBinop(), new TEMP(t), eseq->getE()->accept(this))));
        }
    } else {
        if (node->getLeft()) node->setLeft(node->getLeft()->accept(this));
        if (node->getRight()) node->setRight(node->getRight()->accept(this));
    }
    return node;
}